

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char *significand,
          int significand_size,int integral_size,char16_t decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  size_t sVar2;
  ulong uVar3;
  undefined2 in_register_00000082;
  
  bVar1 = copy_str_noinline<char16_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                    (significand,significand + integral_size,out);
  if (CONCAT22(in_register_00000082,decimal_point) != 0) {
    sVar2 = (bVar1.container)->size_;
    uVar3 = sVar2 + 1;
    if ((bVar1.container)->capacity_ < uVar3) {
      (**(bVar1.container)->_vptr_buffer)(bVar1.container);
      sVar2 = (bVar1.container)->size_;
      uVar3 = sVar2 + 1;
    }
    (bVar1.container)->size_ = uVar3;
    (bVar1.container)->ptr_[sVar2] = decimal_point;
    bVar1 = copy_str_noinline<char16_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (significand + integral_size,significand + significand_size,bVar1);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar1.container;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}